

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O0

void __thiscall bsplib::exception::~exception(exception *this)

{
  exception *this_local;
  
  ~exception(this);
  operator_delete(this,0x1a0);
  return;
}

Assistant:

~exception() throw() 
    {}